

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_full_gain_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  ulong *puVar1;
  double dVar2;
  unsigned_long uVar3;
  double *pdVar4;
  char cVar5;
  ulong *puVar6;
  ulong *puVar7;
  size_t row_1;
  size_t *psVar8;
  size_t col_2;
  size_t sVar9;
  double **ppdVar10;
  size_t col;
  long lVar11;
  size_t row;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ulong *puVar27;
  undefined8 uVar28;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar29;
  double *local_a0;
  size_t *local_98;
  double local_90;
  double local_88;
  float *local_80;
  double *local_78;
  undefined8 uStack_70;
  ulong *local_68;
  undefined8 uStack_60;
  double *local_58;
  double *local_50;
  ulong *local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  if (end <= st) {
    return -INFINITY;
  }
  if ((ncols_use != 0 && cols_use != (size_t *)0x0) &&
     (auVar23._8_4_ = (int)(ncols_use >> 0x20), auVar23._0_8_ = ncols_use,
     auVar23._12_4_ = 0x45300000, auVar16._8_4_ = (int)(ncols >> 0x20), auVar16._0_8_ = ncols,
     auVar16._12_4_ = 0x45300000,
     ((auVar23._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
     ((auVar16._8_8_ - 1.9342813113834067e+25) +
     ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)) < 0.1)) {
    force_cols_use = true;
  }
  local_48 = (ulong *)CONCAT71(local_48._1_7_,force_cols_use);
  local_98 = ix_arr;
  local_80 = x;
  local_68 = cols_use;
  local_58 = (double *)st;
  if (x_uses_ix_arr) {
    psVar8 = ix_arr + st;
    local_88 = 0.0;
    for (sVar12 = st; st = (size_t)local_58, sVar12 <= end; sVar12 = sVar12 + 1) {
      pVar29 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,psVar8);
      local_88 = local_88 + *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
      psVar8 = psVar8 + 1;
    }
  }
  else {
    local_88 = 0.0;
    for (local_a0 = (double *)st; local_a0 <= end; local_a0 = (double *)((long)local_a0 + 1)) {
      pVar29 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,(unsigned_long *)&local_a0);
      local_88 = local_88 + *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
    }
  }
  cVar5 = (char)local_48;
  sVar12 = ncols;
  if ((char)local_48 != '\0') {
    sVar12 = ncols_use;
  }
  local_38 = sVar12 << 3;
  memset(buffer_sum_tot,0,local_38);
  psVar8 = local_98;
  local_50 = (double *)end;
  if (Xr_indptr == (size_t *)0x0) {
    if (cVar5 == '\0') {
      if (x_uses_ix_arr) {
        psVar8 = local_98 + st;
        for (; st <= end; st = st + 1) {
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,psVar8);
          axpy1(*(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8),
                X_row_major + *psVar8 * ncols,buffer_sum_tot,ncols);
          psVar8 = psVar8 + 1;
        }
      }
      else {
        while (local_a0 = (double *)st, st <= end) {
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)&local_a0);
          pdVar4 = local_a0;
          axpy1(*(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8),
                X_row_major + local_98[(long)local_a0] * ncols,buffer_sum_tot,ncols);
          st = (long)pdVar4 + 1;
        }
      }
    }
    else if (x_uses_ix_arr) {
      for (; st <= end; st = st + 1) {
        uVar3 = local_98[st];
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,local_98 + st);
        local_78 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        for (sVar12 = 0; ncols_use != sVar12; sVar12 = sVar12 + 1) {
          dVar15 = fma((double)local_78,X_row_major[uVar3 * ncols + local_68[sVar12]],
                       buffer_sum_tot[sVar12]);
          buffer_sum_tot[sVar12] = dVar15;
        }
      }
    }
    else {
      while (local_a0 = (double *)st, st <= end) {
        sVar12 = local_98[st];
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,(unsigned_long *)&local_a0);
        local_78 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        for (sVar9 = 0; ncols_use != sVar9; sVar9 = sVar9 + 1) {
          dVar15 = fma((double)local_78,X_row_major[sVar12 * ncols + local_68[sVar9]],
                       buffer_sum_tot[sVar9]);
          buffer_sum_tot[sVar9] = dVar15;
        }
        st = (long)local_a0 + 1;
      }
    }
LAB_00266cde:
    memset(buffer_sum_left,0,local_38);
    if (Xr_indptr == (size_t *)0x0) {
      puVar27 = (ulong *)0x0;
      uVar28 = 0;
      local_90 = -INFINITY;
      local_a0 = local_58;
      if ((char)local_48 == '\0') {
        while (psVar8 = local_98, local_a0 < end) {
          ppdVar10 = (double **)(local_98 + (long)local_a0);
          if (!x_uses_ix_arr) {
            ppdVar10 = &local_a0;
          }
          local_68 = puVar27;
          uStack_60 = uVar28;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)ppdVar10);
          pdVar4 = local_a0;
          local_78 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
          sVar12 = psVar8[(long)local_a0];
          axpy1((double)local_78,X_row_major + sVar12 * ncols,buffer_sum_left,ncols);
          puVar27 = (ulong *)((double)local_68 + (double)local_78);
          if (x_uses_ix_arr) {
            bVar13 = NAN(local_80[sVar12]) || NAN(local_80[local_98[(long)pdVar4 + 1]]);
            bVar14 = local_80[sVar12] == local_80[local_98[(long)pdVar4 + 1]];
          }
          else {
            bVar13 = NAN(local_80[(long)pdVar4]) || NAN(local_80[(long)pdVar4 + 1]);
            bVar14 = local_80[(long)pdVar4] == local_80[(long)pdVar4 + 1];
          }
          if ((!bVar14) || (bVar13)) {
            auVar21._8_8_ = local_88 - (double)puVar27;
            auVar21._0_8_ = puVar27;
            dVar15 = 0.0;
            dVar17 = 0.0;
            for (sVar12 = 0; ncols != sVar12; sVar12 = sVar12 + 1) {
              dVar2 = buffer_sum_left[sVar12];
              auVar26._8_8_ = buffer_sum_tot[sVar12] - dVar2;
              auVar26._0_8_ = dVar2;
              auVar23 = divpd(auVar26,auVar21);
              dVar15 = dVar15 + auVar23._0_8_ * dVar2;
              dVar17 = dVar17 + auVar23._8_8_ * (buffer_sum_tot[sVar12] - dVar2);
            }
            if (local_90 < dVar17 + dVar15) {
              *split_ix = (size_t)pdVar4;
              local_90 = dVar17 + dVar15;
            }
          }
          uVar28 = uStack_60;
          local_a0 = (double *)((long)pdVar4 + 1);
        }
      }
      else {
        while (psVar8 = local_98, local_a0 < end) {
          ppdVar10 = (double **)(local_98 + (long)local_a0);
          if (!x_uses_ix_arr) {
            ppdVar10 = &local_a0;
          }
          local_48 = puVar27;
          uStack_40 = uVar28;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)ppdVar10);
          pdVar4 = local_a0;
          local_78 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
          sVar12 = psVar8[(long)local_a0];
          for (sVar9 = 0; ncols_use != sVar9; sVar9 = sVar9 + 1) {
            dVar15 = fma((double)local_78,X_row_major[sVar12 * ncols + local_68[sVar9]],
                         buffer_sum_left[sVar9]);
            buffer_sum_left[sVar9] = dVar15;
          }
          puVar27 = (ulong *)((double)local_48 + (double)local_78);
          if (x_uses_ix_arr) {
            bVar13 = NAN(local_80[sVar12]) || NAN(local_80[local_98[(long)pdVar4 + 1]]);
            bVar14 = local_80[sVar12] == local_80[local_98[(long)pdVar4 + 1]];
          }
          else {
            bVar13 = NAN(local_80[(long)pdVar4]) || NAN(local_80[(long)pdVar4 + 1]);
            bVar14 = local_80[(long)pdVar4] == local_80[(long)pdVar4 + 1];
          }
          if ((!bVar14) || (bVar13)) {
            auVar18._8_8_ = local_88 - (double)puVar27;
            auVar18._0_8_ = puVar27;
            dVar15 = 0.0;
            dVar17 = 0.0;
            for (sVar12 = 0; ncols_use != sVar12; sVar12 = sVar12 + 1) {
              dVar2 = buffer_sum_left[sVar12];
              auVar22._8_8_ = buffer_sum_tot[sVar12] - dVar2;
              auVar22._0_8_ = dVar2;
              auVar23 = divpd(auVar22,auVar18);
              dVar15 = dVar15 + auVar23._0_8_ * dVar2;
              dVar17 = dVar17 + auVar23._8_8_ * (buffer_sum_tot[sVar12] - dVar2);
            }
            if (local_90 < dVar17 + dVar15) {
              *split_ix = (size_t)pdVar4;
              local_90 = dVar17 + dVar15;
            }
          }
          end = (size_t)local_50;
          uVar28 = uStack_40;
          local_a0 = (double *)((long)pdVar4 + 1);
        }
      }
      goto LAB_00267498;
    }
  }
  else {
    if (cVar5 != '\0') {
      puVar27 = local_68 + ncols_use;
      for (local_a0 = (double *)st; local_a0 <= end; local_a0 = (double *)((long)local_a0 + 1)) {
        sVar12 = Xr_indptr[local_98[(long)local_a0]];
        if (sVar12 != Xr_indptr[local_98[(long)local_a0] + 1]) {
          puVar1 = Xr_ind + Xr_indptr[local_98[(long)local_a0] + 1];
          puVar6 = Xr_ind + sVar12;
          local_78 = Xr + sVar12;
          ppdVar10 = (double **)(local_98 + (long)local_a0);
          if (!x_uses_ix_arr) {
            ppdVar10 = &local_a0;
          }
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::try_emplace<unsigned_long_const&>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)ppdVar10);
          local_90 = *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
          puVar7 = local_68;
          while ((end = (size_t)local_50, puVar7 < puVar27 && (puVar6 < puVar1))) {
            if (*puVar6 == *puVar7) {
              lVar11 = (long)puVar7 - (long)local_68;
              dVar15 = fma(local_90,*(double *)((long)local_78 + ((long)puVar1 - (long)puVar6)),
                           *(double *)((long)buffer_sum_tot + lVar11));
              *(double *)((long)buffer_sum_tot + lVar11) = dVar15;
              puVar6 = puVar6 + 1;
              puVar7 = puVar7 + 1;
            }
            else if (*puVar7 < *puVar6) {
              puVar7 = std::
                       __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar7,puVar27,puVar6);
            }
            else {
              puVar6 = std::
                       __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar6,puVar1,puVar7);
            }
          }
        }
      }
      goto LAB_00266cde;
    }
    if (x_uses_ix_arr) {
      psVar8 = local_98 + st;
      for (; st <= end; st = st + 1) {
        sVar12 = Xr_indptr[*psVar8];
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,psVar8);
        axpy1(*(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8),Xr + sVar12,Xr_ind + sVar12
              ,Xr_indptr[*psVar8 + 1] - sVar12,buffer_sum_tot);
        psVar8 = psVar8 + 1;
      }
    }
    else {
      while (local_a0 = (double *)st, st <= end) {
        sVar12 = Xr_indptr[psVar8[st]];
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::try_emplace<unsigned_long_const&>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,(unsigned_long *)&local_a0);
        pdVar4 = local_a0;
        axpy1(*(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8),Xr + sVar12,Xr_ind + sVar12
              ,Xr_indptr[psVar8[(long)local_a0] + 1] - sVar12,buffer_sum_tot);
        st = (long)pdVar4 + 1;
      }
    }
    memset(buffer_sum_left,0,local_38);
  }
  local_a0 = local_58;
  if ((char)local_48 == '\0') {
    puVar27 = (ulong *)0x0;
    local_90 = -INFINITY;
    uVar28 = 0;
    while (psVar8 = local_98, local_a0 < end) {
      ppdVar10 = (double **)(local_98 + (long)local_a0);
      if (!x_uses_ix_arr) {
        ppdVar10 = &local_a0;
      }
      local_68 = puVar27;
      uStack_60 = uVar28;
      pVar29 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,(unsigned_long *)ppdVar10);
      pdVar4 = local_a0;
      local_78 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
      sVar12 = psVar8[(long)local_a0];
      sVar9 = Xr_indptr[sVar12];
      axpy1((double)local_78,Xr + sVar9,Xr_ind + sVar9,Xr_indptr[sVar12 + 1] - sVar9,buffer_sum_left
           );
      puVar27 = (ulong *)((double)local_68 + (double)local_78);
      if (x_uses_ix_arr) {
        bVar13 = NAN(local_80[sVar12]) || NAN(local_80[local_98[(long)pdVar4 + 1]]);
        bVar14 = local_80[sVar12] == local_80[local_98[(long)pdVar4 + 1]];
      }
      else {
        bVar13 = NAN(local_80[(long)pdVar4]) || NAN(local_80[(long)pdVar4 + 1]);
        bVar14 = local_80[(long)pdVar4] == local_80[(long)pdVar4 + 1];
      }
      if ((!bVar14) || (bVar13)) {
        auVar20._8_8_ = local_88 - (double)puVar27;
        auVar20._0_8_ = puVar27;
        dVar15 = 0.0;
        dVar17 = 0.0;
        for (sVar12 = 0; ncols != sVar12; sVar12 = sVar12 + 1) {
          dVar2 = buffer_sum_left[sVar12];
          auVar25._8_8_ = buffer_sum_tot[sVar12] - dVar2;
          auVar25._0_8_ = dVar2;
          auVar23 = divpd(auVar25,auVar20);
          dVar15 = dVar15 + auVar23._0_8_ * dVar2;
          dVar17 = dVar17 + auVar23._8_8_ * (buffer_sum_tot[sVar12] - dVar2);
        }
        if (local_90 < dVar17 + dVar15) {
          *split_ix = (size_t)pdVar4;
          local_90 = dVar17 + dVar15;
        }
      }
      uVar28 = uStack_60;
      local_a0 = (double *)((long)pdVar4 + 1);
    }
  }
  else {
    puVar27 = local_68 + ncols_use;
    local_78 = (double *)0x0;
    uStack_70 = 0;
    local_90 = -INFINITY;
    for (; psVar8 = local_98, local_a0 < end; local_a0 = (double *)((long)local_a0 + 1)) {
      ppdVar10 = (double **)(local_98 + (long)local_a0);
      if (!x_uses_ix_arr) {
        ppdVar10 = &local_a0;
      }
      pVar29 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::try_emplace<unsigned_long_const&>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,(unsigned_long *)ppdVar10);
      local_48 = *(ulong **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
      sVar12 = Xr_indptr[psVar8[(long)local_a0]];
      if (sVar12 != Xr_indptr[psVar8[(long)local_a0] + 1]) {
        puVar1 = Xr_ind + Xr_indptr[psVar8[(long)local_a0] + 1];
        puVar6 = Xr_ind + sVar12;
        local_58 = Xr + sVar12;
        puVar7 = local_68;
        while ((puVar7 < puVar27 && (puVar6 < puVar1))) {
          if (*puVar6 == *puVar7) {
            lVar11 = (long)puVar7 - (long)local_68;
            dVar15 = fma((double)local_48,
                         *(double *)((long)local_58 + ((long)puVar1 - (long)puVar6)),
                         *(double *)((long)buffer_sum_left + lVar11));
            *(double *)((long)buffer_sum_left + lVar11) = dVar15;
            puVar7 = puVar7 + 1;
            puVar6 = puVar6 + 1;
          }
          else if (*puVar7 < *puVar6) {
            puVar7 = std::
                     __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar7,puVar27,puVar6);
          }
          else {
            puVar6 = std::
                     __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar6,puVar1,puVar7);
          }
        }
      }
      local_78 = (double *)((double)local_78 + (double)local_48);
      if (x_uses_ix_arr) {
        bVar13 = NAN(local_80[local_98[(long)local_a0]]) ||
                 NAN(local_80[local_98[(long)local_a0 + 1]]);
        bVar14 = local_80[local_98[(long)local_a0]] == local_80[local_98[(long)local_a0 + 1]];
      }
      else {
        bVar13 = NAN(local_80[(long)local_a0]) || NAN(local_80[(long)local_a0 + 1]);
        bVar14 = local_80[(long)local_a0] == local_80[(long)local_a0 + 1];
      }
      if ((!bVar14) || (bVar13)) {
        auVar19._8_8_ = local_88 - (double)local_78;
        auVar19._0_8_ = local_78;
        dVar15 = 0.0;
        dVar17 = 0.0;
        for (sVar12 = 0; ncols_use != sVar12; sVar12 = sVar12 + 1) {
          dVar2 = buffer_sum_left[sVar12];
          auVar24._8_8_ = buffer_sum_tot[sVar12] - dVar2;
          auVar24._0_8_ = dVar2;
          auVar23 = divpd(auVar24,auVar19);
          dVar15 = dVar15 + auVar23._0_8_ * dVar2;
          dVar17 = dVar17 + auVar23._8_8_ * (buffer_sum_tot[sVar12] - dVar2);
        }
        if (local_90 < dVar17 + dVar15) {
          *split_ix = (size_t)local_a0;
          local_90 = dVar17 + dVar15;
        }
      }
      end = (size_t)local_50;
    }
  }
LAB_00267498:
  dVar15 = -INFINITY;
  if (-INFINITY < local_90) {
    dVar15 = midpoint<float>(local_80[local_98[*split_ix]],local_80[local_98[*split_ix + 1]]);
    *split_point = dVar15;
    dVar15 = local_90 / local_88;
  }
  return dVar15;
}

Assistant:

double find_split_full_gain_weighted(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                                     size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                     double *restrict X_row_major, size_t ncols,
                                     double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                     double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                                     size_t &restrict split_ix, double &restrict split_point,
                                     bool x_uses_ix_arr,
                                     mapping &restrict w)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    double wtot = 0;
    if (x_uses_ix_arr)
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[ix_arr[row]];
    }

    else
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[row];
    }

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[ix_arr[row]], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[row], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;

            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[ix_arr[row]];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[row];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[ix_arr[row]], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[row], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                size_t dtemp;
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_tot[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_tot[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double vleft, vright;
    double wleft = 0;
    double w_row;
    double wright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                axpy1(w_row, X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;

                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_left[col]);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row= w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                ptr_this = Xr_indptr[ix_arr[row]];
                axpy1(w_row, Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            size_t dtemp;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_left[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_left[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain  <= -HUGE_VAL) return best_gain;
    
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return best_gain / wtot;
}